

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block1394eth.cpp
# Opt level: O0

void PrintDebugStream(stringstream *debugStream)

{
  bool bVar1;
  long *plVar2;
  ostream *this;
  allocator<char> local_89;
  string local_88 [32];
  char local_68 [8];
  char line [80];
  stringstream *debugStream_local;
  
  while( true ) {
    plVar2 = (long *)std::istream::getline((char *)debugStream,(long)local_68);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    this = std::operator<<((ostream *)&std::cerr,local_68);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  std::ios::clear(debugStream + *(long *)(*(long *)debugStream + -0x18),0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"",&local_89);
  std::__cxx11::stringstream::str((string *)debugStream);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

void PrintDebugStream(std::stringstream &debugStream)
{
    char line[80];
    while (debugStream.getline(line, sizeof(line)))
        std::cerr << line << std::endl;
    debugStream.clear();
    debugStream.str("");
}